

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O0

int ABC_Check_Integrity(ABC_Manager mng)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  ABC_Manager mng_local;
  
  pNtk_00 = mng->pNtk;
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(pNtk_00->vObjs);
    if (iVar1 <= local_2c) {
      iVar1 = Abc_NtkDoCheck(pNtk_00);
      if (iVar1 == 0) {
        printf("ABC_Check_Integrity: The internal network check has failed.\n");
      }
      mng_local._4_4_ = (uint)(iVar1 != 0);
      return mng_local._4_4_;
    }
    pObj_00 = Abc_NtkObj(pNtk_00,local_2c);
    if ((((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
        (local_2c != 0)) && (iVar1 = Abc_ObjFanoutNum(pObj_00), iVar1 == 0)) break;
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int ABC_Check_Integrity( ABC_Manager mng )
{
    Abc_Ntk_t * pNtk = mng->pNtk;
    Abc_Obj_t * pObj;
    int i;

    // check that there are no dangling nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( i == 0 ) 
            continue;
        if ( Abc_ObjFanoutNum(pObj) == 0 )
        {
//            printf( "ABC_Check_Integrity: The network has dangling nodes.\n" );
            return 0;
        }
    }

    // make sure everything is okay with the network structure
    if ( !Abc_NtkDoCheck( pNtk ) )
    {
        printf( "ABC_Check_Integrity: The internal network check has failed.\n" );
        return 0;
    }
    return 1;
}